

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool Recognition::is_real(string *str)

{
  invalid_argument *this;
  size_type pos;
  
  std::__cxx11::stod(str,&pos);
  if (str->_M_string_length <= pos) {
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"invalid real argument");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static bool is_real(const std::string &str) {
        try {
            std::string::size_type pos;
            std::stod(str, &pos);
            if (pos < str.length()) {
                throw std::invalid_argument("invalid real argument");
            }
            return true;
        } catch (const std::invalid_argument &e) {
            return false;
        } catch (const std::out_of_range &e) {
            return false;
        }
    }